

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpression<const_unsigned_long_&,_(Catch::Internal::Operator)4,_const_unsigned_long_&>
::endExpression(BinaryExpression<const_unsigned_long_&,_(Catch::Internal::Operator)4,_const_unsigned_long_&>
                *this)

{
  ResultBuilder *this_00;
  OfType OVar1;
  
  OVar1 = ExpressionFailed;
  if (*this->m_lhs <= *this->m_rhs) {
    OVar1 = Ok;
  }
  this_00 = this->m_rb;
  (this_00->m_data).resultType = OVar1;
  ResultBuilder::endExpression(this_00,&this->super_DecomposedExpression);
  return;
}

Assistant:

void endExpression() const {
        m_rb
            .setResultType( Internal::compare<Op>( m_lhs, m_rhs ) )
            .endExpression( *this );
    }